

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

int QProcess::execute(QString *program,QStringList *arguments)

{
  bool bVar1;
  ProcessError PVar2;
  ExitStatus EVar3;
  QProcess *in_RSI;
  QProcess *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_0000001c;
  QProcess process;
  ProcessChannelMode in_stack_ffffffffffffff8c;
  QProcess *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QProcess *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QString *in_stack_ffffffffffffffc8;
  int local_20;
  QObject local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d_ptr.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QProcess(in_stack_ffffffffffffffb0,&local_18);
  setProcessChannelMode(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c);
  start(in_RSI,in_stack_ffffffffffffffc8,
        (QStringList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (OpenMode)in_stack_0000001c.i);
  bVar1 = waitForFinished((QProcess *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
  if ((bVar1) && (PVar2 = error(in_stack_ffffffffffffff90), PVar2 != FailedToStart)) {
    EVar3 = exitStatus(in_stack_ffffffffffffff90);
    if (EVar3 == NormalExit) {
      local_20 = exitCode(in_stack_ffffffffffffff90);
    }
    else {
      local_20 = -1;
    }
  }
  else {
    local_20 = -2;
  }
  ~QProcess(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

int QProcess::execute(const QString &program, const QStringList &arguments)
{
    QProcess process;
    process.setProcessChannelMode(ForwardedChannels);
    process.start(program, arguments);
    if (!process.waitForFinished(-1) || process.error() == FailedToStart)
        return -2;
    return process.exitStatus() == QProcess::NormalExit ? process.exitCode() : -1;
}